

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

bool __thiscall
SslTcpSocketImpl::AddServerCertificate
          (SslTcpSocketImpl *this,char *szCAcertificate,char *szHostCertificate,char *szHostKey,
          char *szDhParamFileName)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  SslServerContext local_98;
  char *local_38;
  char *szDhParamFileName_local;
  char *szHostKey_local;
  char *szHostCertificate_local;
  char *szCAcertificate_local;
  SslTcpSocketImpl *this_local;
  
  local_38 = szDhParamFileName;
  szDhParamFileName_local = szHostKey;
  szHostKey_local = szHostCertificate;
  szHostCertificate_local = szCAcertificate;
  szCAcertificate_local = (char *)this;
  OpenSSLWrapper::SslServerContext::SslServerContext(&local_98);
  std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>::
  emplace_back<OpenSSLWrapper::SslServerContext>(&this->m_pServerCtx,&local_98);
  OpenSSLWrapper::SslServerContext::~SslServerContext(&local_98);
  pvVar3 = std::
           vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
           ::back(&this->m_pServerCtx);
  iVar2 = OpenSSLWrapper::SslServerContext::SetCertificates
                    (pvVar3,szHostCertificate_local,szHostKey_local,szDhParamFileName_local);
  if (iVar2 < 1) {
LAB_0011a8ec:
    std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
    ::pop_back(&this->m_pServerCtx);
    this_local._7_1_ = false;
  }
  else {
    if (local_38 != (char *)0x0) {
      pvVar3 = std::
               vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
               ::back(&this->m_pServerCtx);
      bVar1 = OpenSSLWrapper::SslServerContext::SetDhParamFile(pvVar3,local_38);
      if (!bVar1) goto LAB_0011a8ec;
    }
    pvVar3 = std::
             vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
             ::back(&this->m_pServerCtx);
    OpenSSLWrapper::SslServerContext::AddVirtualHost(pvVar3,&this->m_pServerCtx);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SslTcpSocketImpl::AddServerCertificate(const char* szCAcertificate, const char* szHostCertificate, const char* szHostKey, const char* szDhParamFileName)
{
    m_pServerCtx.emplace_back(SslServerContext());
    if (m_pServerCtx.back().SetCertificates(szCAcertificate, szHostCertificate, szHostKey) > 0)
    {
        if (szDhParamFileName == nullptr || m_pServerCtx.back().SetDhParamFile(szDhParamFileName) == true)
        {
            m_pServerCtx.back().AddVirtualHost(&m_pServerCtx);
            return true;
        }
    }

    m_pServerCtx.pop_back();
    return false;
}